

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearCase::ClearCase
          (ClearCase *this,Context *context,char *name,char *description,deUint32 flags)

{
  byte local_2c;
  deUint32 flags_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ClearCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ClearCase_011d0658;
  local_2c = (byte)flags;
  this->m_scissoredClear = (bool)(local_2c & 1);
  this->m_fullscreenScissor = SUB41((flags & 8) >> 3,0);
  this->m_drawTriangles = SUB41((flags & 2) >> 1,0);
  this->m_useGlobalState = (flags & 4) == 0;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::MovePtr(&this->m_vbo);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            (&this->m_perPrimitiveProgram);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            (&this->m_basicProgram);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ::vector(&this->m_drawObjects);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_objectVertices);
  return;
}

Assistant:

ClearCase::ClearCase (Context& context, const char* name, const char* description, deUint32 flags)
	: TestCase				(context, name, description)
	, m_scissoredClear		((flags & SCISSOR_CLEAR_BIT) != 0)
	, m_fullscreenScissor	((flags & FULLSCREEN_SCISSOR_BIT) != 0)
	, m_drawTriangles		((flags & DRAW_TRIANGLE_BIT) != 0)
	, m_useGlobalState		((flags & PER_PRIMITIVE_BBOX_BIT) == 0)
{
	DE_ASSERT(m_useGlobalState || m_drawTriangles); // per-triangle bbox requires triangles
	DE_ASSERT(!m_fullscreenScissor || m_scissoredClear); // fullscreenScissor requires scissoredClear
}